

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

void If_Dec6Verify(word t,word z)

{
  word local_20;
  word r;
  word z_local;
  word t_local;
  
  r = z;
  z_local = t;
  local_20 = If_Dec6Truth(z);
  if (local_20 != z_local) {
    If_DecPrintConfig(r);
    Kit_DsdPrintFromTruth((uint *)&z_local,6);
    printf("\n");
    Kit_DsdPrintFromTruth((uint *)&local_20,6);
    printf("\n");
    printf("Verification failed!\n");
  }
  return;
}

Assistant:

void If_Dec6Verify( word t, word z )
{
    word r = If_Dec6Truth( z );
    if ( r != t )
	{
        If_DecPrintConfig( z );
        Kit_DsdPrintFromTruth( (unsigned*)&t, 6 ); printf( "\n" );
//        Kit_DsdPrintFromTruth( (unsigned*)&q, 6 ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)&r, 6 ); printf( "\n" );
        printf( "Verification failed!\n" );
	}
}